

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_debug.c
# Opt level: O0

char * lua_setlocal(lua_State *L,lua_Debug *ar,int n)

{
  long in_RDI;
  lua_Debug *unaff_retaddr;
  TValue *o;
  char *name;
  undefined8 in_stack_fffffffffffffff0;
  char **in_stack_fffffffffffffff8;
  
  debug_localname((lua_State *)&o->field_2,unaff_retaddr,in_stack_fffffffffffffff8,
                  (BCReg)((ulong)in_stack_fffffffffffffff0 >> 0x20));
  *(long *)(in_RDI + 0x18) = *(long *)(in_RDI + 0x18) + -8;
  return (char *)0x0;
}

Assistant:

LUA_API const char *lua_setlocal(lua_State *L, const lua_Debug *ar, int n)
{
  const char *name = NULL;
  TValue *o = debug_localname(L, ar, &name, (BCReg)n);
  if (name)
    copyTV(L, o, L->top-1);
  L->top--;
  return name;
}